

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FiniteModelMultiSorted.cpp
# Opt level: O3

void __thiscall
FMB::FiniteModelMultiSorted::addFunctionDefinition
          (FiniteModelMultiSorted *this,uint f,DArray<unsigned_int> *args,uint res)

{
  Symbol *this_00;
  int *piVar1;
  uint uVar2;
  OperatorType *pOVar3;
  
  if (((int)args->_size == 0) &&
     (this_00 = *(Symbol **)(*(long *)(DAT_00b521b0 + 0x60) + (ulong)f * 8),
     (this_00->field_0x40 & 4) == 0)) {
    pOVar3 = Kernel::Signature::Symbol::fnType(this_00);
    piVar1 = (this->sortRepr)._array
             [*(uint *)(*(long *)(pOVar3->_key + ((ulong)(*(int *)pOVar3->_key - 1) * 2 + 2) * 4) +
                       8)]._array;
    if (piVar1[res] == -1) {
      piVar1[res] = f;
    }
  }
  pOVar3 = Kernel::Signature::Symbol::fnType
                     (*(Symbol **)(*(long *)(DAT_00b521b0 + 0x60) + (ulong)f * 8));
  uVar2 = args2var(this,args,&this->_sizes,&this->_f_offsets,f,pOVar3);
  (this->_f_interpretation)._array[uVar2] = res;
  return;
}

Assistant:

void FiniteModelMultiSorted::addFunctionDefinition(unsigned f, const DArray<unsigned>& args, unsigned res)
{
  ASS_EQ(env.signature->functionArity(f),args.size());

  unsigned arity = args.size();

  if(arity==0 && !env.signature->getFunction(f)->introduced()){
    TermList srt = env.signature->getFunction(f)->fnType()->result();
    unsigned srtU = srt.term()->functor();
    if(sortRepr[srtU][res] == -1){
      //cout << "Rep " << env.signature->functionName(f) << " for ";
      //cout << env.sorts->sortName(srt) << " and " << res << endl;
      sortRepr[srtU][res]=f;
    }
  }

  unsigned var = args2var(args,_sizes,_f_offsets,f,env.signature->getFunction(f)->fnType());

  ASS_L(var, _f_interpretation.size());
  _f_interpretation[var] = res;
}